

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_logout(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  ProcErrorProc *pPVar1;
  Tcl_Interp *pTVar2;
  int iVar3;
  Tcl_Obj *pTVar4;
  Tcl_HashEntry *errorCode;
  int *extraout_RDX;
  CK_RV chk_rv;
  CK_SLOT_ID slotid;
  char *pcStack_60;
  int tcl_rv;
  long slotid_long;
  Tcl_Obj *tcl_slotid;
  Tcl_Obj *tcl_handle;
  Tcl_HashEntry *tcl_handle_entry;
  tclpkcs11_handle *handle;
  tclpkcs11_interpdata *interpdata;
  Tcl_Obj **objv_local;
  Tcl_Interp *pTStack_20;
  int objc_local;
  Tcl_Interp *interp_local;
  ClientData cd_local;
  
  interpdata = (tclpkcs11_interpdata *)objv;
  objv_local._4_4_ = objc;
  pTStack_20 = interp;
  interp_local = (Tcl_Interp *)cd;
  if (cd == (ClientData)0x0) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid clientdata",-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar4);
    cd_local._4_4_ = 1;
  }
  else if (objc == 3) {
    tcl_slotid = objv[1];
    slotid_long = (long)objv[2];
    handle = (tclpkcs11_handle *)cd;
    tcl_handle = (Tcl_Obj *)(**(code **)((long)cd + 0x40))(cd,tcl_slotid);
    pTVar2 = pTStack_20;
    if (tcl_handle == (Tcl_Obj *)0x0) {
      pPVar1 = tclStubsPtr->tcl_SetObjResult;
      pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
      (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
      cd_local._4_4_ = 1;
    }
    else {
      tcl_handle_entry = (Tcl_HashEntry *)tcl_handle->typePtr;
      if ((Tcl_ObjType *)tcl_handle_entry == (Tcl_ObjType *)0x0) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
        cd_local._4_4_ = 1;
      }
      else {
        cd_local._4_4_ =
             (*tclStubsPtr->tcl_GetLongFromObj)
                       ((Tcl_Interp_conflict *)pTStack_20,(Tcl_Obj *)slotid_long,
                        (long *)&stack0xffffffffffffffa0);
        if (cd_local._4_4_ == 0) {
          iVar3 = tclpkcs11_start_session
                            ((tclpkcs11_handle *)tcl_handle_entry,(CK_SLOT_ID)pcStack_60);
          pTVar2 = pTStack_20;
          if ((long)iVar3 == 0) {
            errorCode = (*tcl_handle_entry->tablePtr[1].createProc)
                                  ((Tcl_HashTable *)(tcl_handle_entry->key).objPtr,pcStack_60,
                                   extraout_RDX);
            pTVar2 = pTStack_20;
            if (errorCode != (Tcl_HashEntry *)0x0) {
              if (errorCode != (Tcl_HashEntry *)0x32) {
                pPVar1 = tclStubsPtr->tcl_SetObjResult;
                pTVar4 = tclpkcs11_pkcs11_error((CK_RV)errorCode);
                (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
                return 1;
              }
              *(undefined4 *)&tcl_handle_entry->hash = 0;
              (*(code *)tcl_handle_entry->tablePtr[1].staticBuckets[2])
                        ((tcl_handle_entry->key).oneWordValue);
            }
            pTVar2 = pTStack_20;
            pPVar1 = tclStubsPtr->tcl_SetObjResult;
            pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(1);
            (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
            cd_local._4_4_ = 0;
          }
          else {
            pPVar1 = tclStubsPtr->tcl_SetObjResult;
            pTVar4 = tclpkcs11_pkcs11_error((long)iVar3);
            (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
            cd_local._4_4_ = 1;
          }
        }
      }
    }
  }
  else {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)
                       ("wrong # args: should be \"pki::pkcs11::login handle slot\"",-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar4);
    cd_local._4_4_ = 1;
  }
  return cd_local._4_4_;
}

Assistant:

MODULE_SCOPE int tclpkcs11_logout(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid;
  long slotid_long;
  int tcl_rv;

  CK_SLOT_ID slotid;
  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 3) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::login handle slot\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  chk_rv = handle->pkcs11->C_Logout(handle->session);
  if (chk_rv != CKR_OK) {
    if (chk_rv == CKR_DEVICE_REMOVED) {
      handle->session_active = 0;

      handle->pkcs11->C_CloseSession(handle->session);
    } else {
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      return(TCL_ERROR);
    }
  }

  Tcl_SetObjResult(interp, Tcl_NewBooleanObj(1));

  return(TCL_OK);
}